

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::bson::basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_>::read_e_name
          (basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,
          json_visitor *visitor,bson_container_type type,error_code *ec)

{
  byte bVar1;
  size_t length;
  type tVar2;
  size_type local_30;
  pointer local_28;
  
  (this->name_buffer_)._M_string_length = 0;
  *(this->name_buffer_)._M_dataplus._M_p = '\0';
  read_cstring(this,&this->name_buffer_,ec);
  if (type == document && ec->_M_value == 0) {
    tVar2 = unicode_traits::validate<char>
                      ((unicode_traits *)(this->name_buffer_)._M_dataplus._M_p,
                       (char *)(this->name_buffer_)._M_string_length,length);
    if (tVar2.ec == success) {
      local_28 = (this->name_buffer_)._M_dataplus._M_p;
      local_30 = (this->name_buffer_)._M_string_length;
      (*visitor->_vptr_basic_json_visitor[9])(visitor,&local_30,this,ec);
      bVar1 = this->cursor_mode_ ^ 1;
    }
    else {
      std::error_code::operator=(ec,invalid_utf8_text_string);
      bVar1 = false;
    }
    this->more_ = (bool)bVar1;
  }
  return;
}

Assistant:

void read_e_name(json_visitor& visitor, jsoncons::bson::bson_container_type type, std::error_code& ec)
    {
        name_buffer_.clear();
        read_cstring(name_buffer_, ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            return;
        }
        if (type == jsoncons::bson::bson_container_type::document)
        {
            auto result = unicode_traits::validate(name_buffer_.data(),name_buffer_.size());
            if (JSONCONS_UNLIKELY(result.ec != unicode_traits::conv_errc()))
            {
                ec = bson_errc::invalid_utf8_text_string;
                more_ = false;
                return;
            }
            visitor.key(jsoncons::basic_string_view<char>(name_buffer_.data(),name_buffer_.length()), *this, ec);
            more_ = !cursor_mode_;
        }
    }